

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void TableSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiTable *pIVar1;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 != (ctx->Tables).Buf.Size; i_00 = i_00 + 1) {
    pIVar1 = ImVector<ImGuiTable>::operator[](&(ctx->Tables).Buf,i_00);
    pIVar1->SettingsOffset = -1;
  }
  ImVector<char>::clear(&(ctx->SettingsTables).Buf);
  return;
}

Assistant:

static void TableSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetSize(); i++)
        g.Tables.GetByIndex(i)->SettingsOffset = -1;
    g.SettingsTables.clear();
}